

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall
soul::heart::Parser::parseReadStream
          (Parser *this,FunctionParseState *state,FunctionBuilder *builder,AssignmentTarget *target)

{
  bool bVar1;
  Module *pMVar2;
  IODeclaration *this_00;
  Expression *dest;
  InputDeclaration *src_00;
  Identifier *args;
  string_view name_00;
  Type local_c0;
  undefined1 local_a8 [40];
  CompileMessage local_80;
  string_view local_48;
  undefined1 local_38 [8];
  pool_ptr<soul::heart::InputDeclaration> src;
  Identifier name;
  AssignmentTarget *target_local;
  FunctionBuilder *builder_local;
  FunctionParseState *state_local;
  Parser *this_local;
  
  src.object = (InputDeclaration *)parseGeneralIdentifier(this);
  pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
  local_48 = Identifier::operator_cast_to_basic_string_view((Identifier *)&src);
  name_00._M_str = (char *)local_48._M_len;
  name_00._M_len = (size_t)pMVar2;
  Module::findInput((Module *)local_38,name_00);
  bVar1 = pool_ptr<soul::heart::InputDeclaration>::operator==
                    ((pool_ptr<soul::heart::InputDeclaration> *)local_38,(void *)0x0);
  if (bVar1) {
    Errors::cannotFindInput<soul::Identifier&>(&local_80,(Errors *)&src,args);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_80);
    CompileMessage::~CompileMessage(&local_80);
  }
  CodeLocation::CodeLocation
            ((CodeLocation *)(local_a8 + 8),
             &(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).location);
  this_00 = &pool_ptr<soul::heart::InputDeclaration>::operator->
                       ((pool_ptr<soul::heart::InputDeclaration> *)local_38)->super_IODeclaration;
  IODeclaration::getSingleDataType(&local_c0,this_00);
  AssignmentTarget::create
            ((AssignmentTarget *)local_a8,(FunctionParseState *)target,(FunctionBuilder *)state,
             (Type *)builder);
  dest = pool_ptr<soul::heart::Expression>::operator*((pool_ptr<soul::heart::Expression> *)local_a8)
  ;
  src_00 = pool_ptr<soul::heart::InputDeclaration>::operator*
                     ((pool_ptr<soul::heart::InputDeclaration> *)local_38);
  BlockBuilder::addReadStream
            (&builder->super_BlockBuilder,(CodeLocation *)(local_a8 + 8),dest,src_00);
  pool_ptr<soul::heart::Expression>::~pool_ptr((pool_ptr<soul::heart::Expression> *)local_a8);
  Type::~Type(&local_c0);
  CodeLocation::~CodeLocation((CodeLocation *)(local_a8 + 8));
  expectSemicolon(this);
  pool_ptr<soul::heart::InputDeclaration>::~pool_ptr
            ((pool_ptr<soul::heart::InputDeclaration> *)local_38);
  return;
}

Assistant:

void parseReadStream (FunctionParseState& state, FunctionBuilder& builder, const AssignmentTarget& target)
    {
        auto name = parseGeneralIdentifier();
        auto src = module->findInput (name);

        if (src == nullptr)
            throwError (Errors::cannotFindInput (name));

        builder.addReadStream (location, *target.create (state, builder, src->getSingleDataType()), *src);
        expectSemicolon();
    }